

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

void __thiscall phosg::io_error::io_error(io_error *this,int fd)

{
  uint *puVar1;
  int *piVar2;
  int error;
  string local_c8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  io_error *piStack_10;
  int fd_local;
  io_error *this_local;
  
  local_14 = fd;
  piStack_10 = this;
  ::std::__cxx11::to_string(&local_98,fd);
  ::std::operator+(&local_78,"io error on fd ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
  ::std::operator+(&local_58,&local_78,": ");
  puVar1 = (uint *)__errno_location();
  string_for_error_abi_cxx11_(&local_c8,(phosg *)(ulong)*puVar1,error);
  ::std::operator+(&local_38,&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8);
  ::std::runtime_error::runtime_error((runtime_error *)&this->field_0x10,(string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_c8);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_98);
  this->_vptr_io_error = (_func_int **)0x14ab28;
  *(undefined8 *)&this->field_0x10 = 0x14ab58;
  piVar2 = __errno_location();
  this->error = *piVar2;
  return;
}

Assistant:

io_error::io_error(int fd)
    : runtime_error("io error on fd " + to_string(fd) + ": " + string_for_error(errno)),
      error(errno) {}